

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

DdNode * Cudd_CubeArrayToBdd(DdManager *dd,int *array)

{
  int *piVar1;
  uint i;
  DdNode *pDVar2;
  DdNode *f;
  
  i = Cudd_ReadSize(dd);
  f = dd->one;
  piVar1 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  while( true ) {
    do {
      if ((int)i < 1) {
        piVar1 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return f;
      }
      i = i - 1;
    } while (1 < (uint)array[i]);
    pDVar2 = Cudd_bddIthVar(dd,i);
    pDVar2 = Cudd_bddAnd(dd,f,(DdNode *)((ulong)(array[i] == 0) ^ (ulong)pDVar2));
    if (pDVar2 == (DdNode *)0x0) break;
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,f);
    f = pDVar2;
  }
  Cudd_RecursiveDeref(dd,f);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_CubeArrayToBdd(
  DdManager *dd,
  int *array)
{
    DdNode *cube, *var, *tmp;
    int i;
    int size = Cudd_ReadSize(dd);

    cube = DD_ONE(dd);
    cuddRef(cube);
    for (i = size - 1; i >= 0; i--) {
        if ((array[i] & ~1) == 0) {
            var = Cudd_bddIthVar(dd,i);
            tmp = Cudd_bddAnd(dd,cube,Cudd_NotCond(var,array[i]==0));
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,cube);
                return(NULL);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,cube);
            cube = tmp;
        }
    }
    cuddDeref(cube);
    return(cube);

}